

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_long>::__encodeArray
          (FastPForImpl<4U,_unsigned_long> *this,unsigned_long *in,size_t length,uint32_t *out,
          size_t *nvalue)

{
  uint uVar1;
  uint32_t *puVar2;
  reference pvVar3;
  ulong *puVar4;
  reference pvVar5;
  size_type sVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference this_01;
  undefined4 *in_RCX;
  long in_RDX;
  byte *pbVar7;
  long in_RSI;
  size_type in_RDI;
  long *in_R8;
  size_t nValue;
  uint32_t k_3;
  uint32_t k_2;
  unsigned_long bitmap;
  uint8_t *pad8;
  uint32_t bytescontainersize;
  uint32_t k_1;
  unsigned_long maxval;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *thisexceptioncontainer;
  uint8_t maxb;
  uint8_t bestcexcept;
  uint8_t *in_stack_00000070;
  uint8_t bestb;
  unsigned_long *final;
  uint8_t *bc;
  uint32_t k;
  uint32_t *headerout;
  uint32_t *initout;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff40;
  unsigned_long *source;
  uint local_98;
  uint local_94;
  ulong local_90;
  ulong *local_88;
  uint local_6c;
  byte local_53;
  byte local_52;
  byte local_51;
  byte *local_48;
  uint local_3c;
  undefined4 *puVar8;
  unsigned_long *puVar9;
  long local_10;
  
  puVar8 = in_RCX;
  checkifdivisibleby((size_t)in_RCX,(uint32_t)((ulong)in_R8 >> 0x20));
  puVar2 = puVar8 + 1;
  for (local_3c = 0; local_3c < 0x41; local_3c = local_3c + 1) {
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 8),(ulong)local_3c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1296d4);
  }
  local_48 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x20),0);
  for (local_10 = in_RSI; local_10 + 0x400U <= (ulong)(in_RSI + in_RDX * 8);
      local_10 = local_10 + 0x400) {
    getBestBFromData((FastPForImpl<4U,_unsigned_long> *)bc,final,in_stack_00000070,
                     (uint8_t *)thisexceptioncontainer,(uint8_t *)maxval);
    *local_48 = local_51;
    pbVar7 = local_48 + 2;
    local_48[1] = local_52;
    if (local_52 != 0) {
      local_48 = local_48 + 3;
      *pbVar7 = local_53;
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 8),(long)(int)((uint)local_53 - (uint)local_51));
      for (local_6c = 0; pbVar7 = local_48, local_6c < 0x80; local_6c = local_6c + 1) {
        if ((ulong)(1L << (local_51 & 0x3f)) <= *(ulong *)(local_10 + (ulong)local_6c * 8)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (in_stack_ffffffffffffff40,
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          *local_48 = (byte)local_6c;
          local_48 = local_48 + 1;
        }
      }
    }
    local_48 = pbVar7;
    puVar2 = packblockup<128u,unsigned_long>
                       ((unsigned_long *)in_stack_ffffffffffffff40,
                        (uint32_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0)
    ;
  }
  *puVar8 = (int)((long)puVar2 - (long)puVar8 >> 2);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x20),0);
  uVar1 = (int)local_48 - (int)pvVar3;
  source = (unsigned_long *)(puVar2 + 1);
  *puVar2 = uVar1;
  puVar9 = source;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x20),0);
  memcpy(source,pvVar3,(ulong)uVar1);
  puVar4 = (ulong *)(((ulong)uVar1 + 3 & 0xfffffffffffffffc) + (long)puVar9);
  local_88 = (ulong *)((long)puVar9 + (ulong)uVar1);
  while (local_88 < puVar4) {
    *(undefined1 *)local_88 = 0;
    local_88 = (ulong *)((long)local_88 + 1);
  }
  local_90 = 0;
  for (local_94 = 2; local_94 < 0x41; local_94 = local_94 + 1) {
    pvVar5 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 8),(ulong)local_94);
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
    if (sVar6 != 0) {
      local_90 = 1L << ((char)local_94 - 1U & 0x3f) | local_90;
    }
  }
  *puVar4 = local_90;
  puVar4 = puVar4 + 1;
  for (local_98 = 2; local_98 < 0x41; local_98 = local_98 + 1) {
    pvVar5 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 8),(ulong)local_98);
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
    if (sVar6 != 0) {
      pvVar5 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RDI + 8),(ulong)local_98);
      this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
      pvVar5 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RDI + 8),(ulong)local_98);
      this_01 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)(in_RDI + 8),(ulong)local_98);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_01);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,in_RDI);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 8),(ulong)local_98);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x129b0d);
      puVar4 = (ulong *)packingvector<32U>::packmeuptightwithoutmask<unsigned_long>
                                  (source,(size_t)local_48,(uint32_t *)pvVar5,
                                   in_stack_ffffffffffffff3c);
    }
  }
  *in_R8 = (long)puVar4 - (long)in_RCX >> 2;
  return;
}

Assistant:

void __encodeArray(const IntType *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out;  // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++;  // keep track of this
    for (uint32_t k = 0; k < sizeof(IntType) * 8 + 1; ++k) {
      datatobepacked[k].clear();
    }
    uint8_t *bc = &bytescontainer[0];
    for (const IntType *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<IntType> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const IntType maxval = static_cast<IntType>(1ULL << bestb);
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    IntType bitmap = 0;
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() != 0) bitmap |= (1ULL << (k - 1));
    }
    *(reinterpret_cast<IntType *>(out)) = bitmap;
    out += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);

    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() > 0) {
        size_t nValue = datatobepacked[k].size();
        datatobepacked[k].resize((datatobepacked[k].size() + 32 - 1) / 32 * 32);
        out = packingvector<32>::packmeuptightwithoutmask(
            datatobepacked[k].data(), nValue, out, k);
      }
    }
    nvalue = out - initout;
  }